

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execNegRg<(moira::Instr)84,(moira::Mode)0,(moira::Size)4>(Moira *this,u16 opcode)

{
  uint uVar1;
  u32 uVar2;
  bool bVar3;
  uint uVar4;
  ulong uVar5;
  
  uVar1 = *(uint *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58);
  uVar5 = -((ulong)(this->reg).sr.x + (ulong)uVar1);
  bVar3 = (bool)((byte)(uVar5 >> 0x20) & 1);
  (this->reg).sr.c = bVar3;
  (this->reg).sr.x = bVar3;
  uVar4 = (uint)uVar5;
  (this->reg).sr.v = (int)(uVar4 & uVar1) < 0;
  if (uVar4 != 0) {
    (this->reg).sr.z = false;
  }
  (this->reg).sr.n = (bool)((byte)(uVar5 >> 0x1f) & 1);
  uVar2 = (this->reg).pc;
  (this->reg).pc0 = uVar2;
  (this->queue).ird = (this->queue).irc;
  uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar2 + 2);
  (this->queue).irc = (u16)uVar2;
  (*this->_vptr_Moira[0x19])(this,2);
  *(uint *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58) = uVar4;
  return;
}

Assistant:

void
Moira::execNegRg(u16 opcode)
{
    int dst = ( _____________xxx(opcode) );
    u32 ea, data;

    if (!readOp<M,S>(dst, ea, data)) return;

    data = logic<I,S>(data);
    prefetch<POLLIPL>();

    if (S == Long) sync(2);
    writeD<S>(dst, data);
}